

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

bool __thiscall GrcManager::Compile(GrcManager *this,GrcFont *param_1,char *pchOutputPath)

{
  if (this->m_fPassOptimizations == true) {
    PassOptimizations(this);
  }
  if (this->m_fVerbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Generating FSMs: ",0x12);
  }
  GenerateFsms(this,pchOutputPath);
  if (this->m_fVerbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]\n",2);
  }
  GdlRenderer::CalculateContextOffsets(this->m_prndr);
  CalculateGlatVersion(this);
  return false;
}

Assistant:

bool GrcManager::Compile(GrcFont * /*pfont*/, char * pchOutputPath)
{
	if (IncludePassOptimizations())
		PassOptimizations();
	if (this->IsVerbose())
		std::cout << "[Generating FSMs: ";
	GenerateFsms(pchOutputPath);
	if (this->IsVerbose())
		std::cout << "]\n";
	CalculateContextOffsets();	// after max-rule-context has been set
	CalculateGlatVersion();		// before outputting debug files
	return false;
}